

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasExtensionsOrExtendableMessage(Descriptor *descriptor)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Descriptor *in_RDI;
  int i;
  int index;
  bool local_1;
  
  iVar2 = Descriptor::extension_range_count(in_RDI);
  if (iVar2 < 1) {
    iVar2 = Descriptor::extension_count(in_RDI);
    if (iVar2 < 1) {
      iVar2 = 0;
      while (index = iVar2, iVar3 = Descriptor::nested_type_count(in_RDI), iVar2 < iVar3) {
        Descriptor::nested_type(in_RDI,index);
        bVar1 = HasExtensionsOrExtendableMessage((Descriptor *)CONCAT44(index,iVar2));
        if (bVar1) {
          return true;
        }
        iVar2 = index + 1;
      }
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool HasExtensionsOrExtendableMessage(const Descriptor* descriptor) {
  if (descriptor->extension_range_count() > 0) return true;
  if (descriptor->extension_count() > 0) return true;
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasExtensionsOrExtendableMessage(descriptor->nested_type(i))) {
      return true;
    }
  }
  return false;
}